

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::update_peer_port
          (torrent *this,int port,torrent_peer *p,peer_source_flags_t src)

{
  torrent_state st;
  torrent_state tStack_d8;
  
  need_peer_list(this);
  get_peer_list_state(&tStack_d8,this);
  peer_list::update_peer_port
            ((this->super_torrent_hot_members).m_peer_list._M_t.
             super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
             .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl,port,p,src,
             &tStack_d8);
  peers_erased(this,&tStack_d8.erased);
  update_want_peers(this);
  ::std::
  _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  ~_Vector_base(&tStack_d8.erased.
                 super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               );
  return;
}

Assistant:

void torrent::update_peer_port(int const port, torrent_peer* p
		, peer_source_flags_t const src)
	{
		need_peer_list();
		torrent_state st = get_peer_list_state();
		m_peer_list->update_peer_port(port, p, src, &st);
		peers_erased(st.erased);
		update_want_peers();
	}